

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *pWVar1;
  word *pwVar2;
  SegmentReader **ppSVar3;
  SegmentReader **ppSVar4;
  SegmentReader **ppSVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Exception *pEVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 *puVar14;
  DebugComparison<int_&,_int> *pDVar15;
  uint uVar16;
  WirePointer *pWVar17;
  char *pcVar18;
  Iterator __end6;
  undefined1 *puVar19;
  Iterator __begin6;
  uint uVar20;
  ulong uVar21;
  WirePointer *pWVar22;
  WirePointer *pWVar23;
  undefined1 *puVar24;
  bool bVar25;
  MessageSizeCounts MVar26;
  SegmentReader *segment_local;
  int nestingLimit_local;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  Iterator __end7;
  WordCountN<29> wordCount;
  Fault f_3;
  
  uVar10 = (ref->offsetAndKind).value;
  if ((ref->field_1).upper32Bits != 0 || uVar10 != 0) {
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.left = &nestingLimit_local;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = 0 < nestingLimit;
    segment_local = segment;
    if (nestingLimit < 1) {
      pDVar15 = (DebugComparison<int_&,_int> *)&f;
      nestingLimit_local = nestingLimit;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[30]>
                ((Fault *)pDVar15,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x312,FAILED,"nestingLimit > 0","_kjCondition,\"Message is too deeply-nested.\"",
                 &_kjCondition,(char (*) [30])"Message is too deeply-nested.");
    }
    else {
      nestingLimit_local = nestingLimit + -1;
      pWVar23 = ref + 1;
      lVar13 = (long)((int)uVar10 >> 2);
      if (segment == (SegmentReader *)0x0) {
        pWVar23 = pWVar23 + lVar13;
        ppSVar3 = (SegmentReader **)_kjCondition.left;
        ppSVar4 = (SegmentReader **)_kjCondition.left;
        ppSVar5 = (SegmentReader **)_kjCondition.left;
        switch(uVar10 & 3) {
        case 1:
          goto switchD_00125658_caseD_1;
        case 2:
          goto switchD_00125658_caseD_2;
        case 3:
          goto switchD_00125658_caseD_3;
        }
        goto switchD_00125658_caseD_0;
      }
      pwVar2 = (segment->ptr).ptr;
      pWVar22 = (WirePointer *)(pwVar2 + (segment->ptr).size_);
      pWVar17 = pWVar23 + lVar13;
      if ((long)pWVar22 - (long)pWVar23 >> 3 < lVar13) {
        pWVar17 = pWVar22;
      }
      if (lVar13 < (long)pwVar2 - (long)pWVar23 >> 3) {
        pWVar17 = pWVar22;
      }
      if ((uVar10 & 3) == 2) {
        iVar6 = (*segment->arena->_vptr_Arena[2])();
        segment_local = (SegmentReader *)CONCAT44(extraout_var,iVar6);
        _kjCondition.right = 0;
        _kjCondition._12_4_ = 0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = segment_local != (SegmentReader *)0x0;
        if (segment_local == (SegmentReader *)0x0) {
          pDVar15 = (DebugComparison<int_&,_int> *)&f;
          _kjCondition.left = (int *)&segment_local;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                    ((Fault *)pDVar15,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x244,FAILED,"segment != nullptr",
                     "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                     (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                     (char (*) [49])"Message contains far pointer to unknown segment.");
          goto LAB_00125825;
        }
        uVar10 = (ref->offsetAndKind).value;
        uVar21 = (ulong)(uVar10 >> 3);
        uVar12 = (segment_local->ptr).size_;
        if ((long)uVar12 < (long)uVar21) {
          uVar21 = uVar12;
        }
        uVar11 = 2 - (ulong)((uVar10 & 4) == 0);
        _kjCondition.left = (int *)&segment_local;
        if (uVar11 + uVar21 <= uVar12) {
          pWVar22 = (WirePointer *)((segment_local->ptr).ptr + uVar21);
          uVar12 = segment_local->readLimiter->limit;
          if (uVar11 <= uVar12) {
            segment_local->readLimiter->limit = uVar12 - uVar11;
            if (((ref->offsetAndKind).value & 4) != 0) {
              _kjCondition.left = (int *)&segment_local;
              iVar6 = (*segment_local->arena->_vptr_Arena[2])
                                (segment_local->arena,(ulong)(pWVar22->field_1).upper32Bits);
              f.exception = (Exception *)CONCAT44(extraout_var_00,iVar6);
              _kjCondition.left = (int *)&f;
              _kjCondition.right = 0;
              _kjCondition._12_4_ = 0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = f.exception != (Exception *)0x0;
              if (f.exception == (Exception *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          (&f_3,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,(DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
                            &_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_001259fc:
                pWVar17 = (WirePointer *)0x0;
                kj::_::Debug::Fault::~Fault(&f_3);
              }
              else {
                uVar10 = (pWVar22->offsetAndKind).value & 3;
                _kjCondition.left = (int *)CONCAT44(2,uVar10);
                _kjCondition._8_8_ = anon_var_dwarf_1caca;
                _kjCondition.op.content.ptr = (char *)0x5;
                _kjCondition.op.content.size_ = (size_t)(uVar10 == 2);
                if (uVar10 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            (&f_3,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_001259fc;
                }
                pcVar18 = (char *)(ulong)((pWVar22->offsetAndKind).value >> 3);
                if ((long)(f.exception)->file < (long)pcVar18) {
                  pcVar18 = (f.exception)->file;
                }
                pWVar17 = (WirePointer *)
                          (((ArrayPtr<const_capnp::word> *)
                           &((f.exception)->ownFile).content.disposer)->ptr + (long)pcVar18);
                segment_local = (SegmentReader *)f.exception;
              }
              ref = pWVar22 + 1;
              goto LAB_001254fa;
            }
            pWVar1 = pWVar22 + 1;
            uVar10 = (pWVar22->offsetAndKind).value;
            lVar13 = (long)((int)uVar10 >> 2);
            pWVar23 = pWVar1 + lVar13;
            ref = pWVar22;
            if (segment_local == (SegmentReader *)0x0) {
              _kjCondition.left = (int *)&segment_local;
              ppSVar3 = &segment_local;
              ppSVar4 = &segment_local;
              ppSVar5 = &segment_local;
              switch(uVar10 & 3) {
              case 1:
                goto switchD_00125658_caseD_1;
              case 2:
                goto switchD_00125658_caseD_2;
              case 3:
                goto switchD_00125658_caseD_3;
              }
            }
            else {
              pwVar2 = (segment_local->ptr).ptr;
              pWVar17 = (WirePointer *)(pwVar2 + (segment_local->ptr).size_);
              _kjCondition.left = (int *)&segment_local;
              if ((lVar13 < (long)pwVar2 - (long)pWVar1 >> 3) ||
                 (_kjCondition.left = (int *)&segment_local,
                 (long)pWVar17 - (long)pWVar1 >> 3 < lVar13)) goto LAB_001254fa;
              _kjCondition.left = (int *)&segment_local;
              ppSVar3 = &segment_local;
              ppSVar4 = &segment_local;
              ppSVar5 = &segment_local;
              switch(uVar10 & 3) {
              case 1:
                goto switchD_00125658_caseD_1;
              case 2:
                goto switchD_00125658_caseD_2;
              case 3:
                goto switchD_00125658_caseD_3;
              }
            }
            goto switchD_00125658_caseD_0;
          }
          _kjCondition.left = (int *)&segment_local;
          (*segment_local->arena->_vptr_Arena[3])();
        }
        f.exception = f.exception & 0xffffffffffffff00;
        pDVar15 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)pDVar15,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&f,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      else {
LAB_001254fa:
        if (pWVar17 == (WirePointer *)0x0) goto LAB_0012582f;
        uVar10 = (ref->offsetAndKind).value;
        pWVar23 = pWVar17;
        ppSVar3 = (SegmentReader **)_kjCondition.left;
        ppSVar4 = (SegmentReader **)_kjCondition.left;
        ppSVar5 = (SegmentReader **)_kjCondition.left;
        switch(uVar10 & 3) {
        case 0:
switchD_00125658_caseD_0:
          _kjCondition.left = (int *)ppSVar5;
          uVar9 = *(ushort *)&ref->field_1;
          if (segment_local == (SegmentReader *)0x0) {
LAB_00125675:
            uVar12 = (ulong)(ref->field_1).structRef.ptrCount.value;
            puVar24 = (undefined1 *)(uVar12 + uVar9);
            pWVar23 = pWVar23 + uVar9;
            puVar14 = (undefined1 *)0x0;
            while (bVar25 = uVar12 != 0, uVar12 = uVar12 - 1, bVar25) {
              MVar26 = totalSize(segment_local,pWVar23,nestingLimit_local);
              puVar24 = puVar24 + MVar26.wordCount;
              puVar14 = (undefined1 *)(ulong)((int)puVar14 + MVar26.capCount);
              pWVar23 = pWVar23 + 1;
            }
            goto LAB_00125832;
          }
          uVar12 = (ulong)(ref->field_1).structRef.ptrCount.value + (ulong)uVar9;
          if (((long)pWVar23 - (long)(segment_local->ptr).ptr >> 3) + uVar12 <=
              (segment_local->ptr).size_) {
            uVar21 = segment_local->readLimiter->limit;
            if (uVar12 <= uVar21) {
              segment_local->readLimiter->limit = uVar21 - uVar12;
              uVar9 = (ref->field_1).structRef.dataSize.value;
              goto LAB_00125675;
            }
            (*segment_local->arena->_vptr_Arena[3])();
          }
          f.exception = f.exception & 0xffffffffffffff00;
          pDVar15 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                    ((Fault *)pDVar15,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x322,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                     "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [322])
                     "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          break;
        case 1:
switchD_00125658_caseD_1:
          _kjCondition.left = (int *)ppSVar4;
          uVar10 = (ref->field_1).upper32Bits;
          puVar14 = (undefined1 *)(ulong)(uVar10 & 7);
          switch(uVar10 & 7) {
          case 0:
            puVar24 = puVar14;
            goto LAB_00125832;
          default:
            puVar24 = (undefined1 *)
                      ((ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (long)puVar14 * 4) *
                       (ulong)(uVar10 >> 3) + 0x3f >> 6);
            puVar14 = (undefined1 *)0x0;
            if (segment_local == (SegmentReader *)0x0) goto LAB_00125832;
            uVar12 = (ulong)puVar24 & 0xffffffff;
            if (((long)pWVar23 - (long)(segment_local->ptr).ptr >> 3) + uVar12 <=
                (segment_local->ptr).size_) {
              uVar21 = segment_local->readLimiter->limit;
              if (uVar12 <= uVar21) {
                segment_local->readLimiter->limit = uVar21 - uVar12;
                puVar14 = (undefined1 *)0x0;
                goto LAB_00125832;
              }
              (*segment_local->arena->_vptr_Arena[3])();
            }
            pcVar18 = "boundsCheck(segment, ptr, totalWords)";
            iVar6 = 0x33d;
            break;
          case 6:
            if (segment_local == (SegmentReader *)0x0) {
LAB_00125ac2:
              puVar19 = (undefined1 *)(ulong)(uVar10 >> 3);
              puVar14 = (undefined1 *)0x0;
              puVar24 = puVar19;
              while (bVar25 = puVar19 != (undefined1 *)0x0, puVar19 = puVar19 + -1, bVar25) {
                MVar26 = totalSize(segment_local,pWVar23,nestingLimit_local);
                puVar24 = puVar24 + MVar26.wordCount;
                puVar14 = (undefined1 *)(ulong)((int)puVar14 + MVar26.capCount);
                pWVar23 = pWVar23 + 1;
              }
              goto LAB_00125832;
            }
            uVar12 = (ulong)(uVar10 >> 3);
            if (((long)pWVar23 - (long)(segment_local->ptr).ptr >> 3) + uVar12 <=
                (segment_local->ptr).size_) {
              uVar21 = segment_local->readLimiter->limit;
              if (uVar12 <= uVar21) {
                segment_local->readLimiter->limit = uVar21 - uVar12;
                goto LAB_00125ac2;
              }
              (*segment_local->arena->_vptr_Arena[3])();
            }
            pcVar18 = "boundsCheck(segment, ptr, count * WORDS_PER_POINTER)";
            iVar6 = 0x348;
            break;
          case 7:
            wordCount = uVar10 >> 3;
            pEVar8 = (Exception *)(ulong)wordCount;
            if (segment_local == (SegmentReader *)0x0) {
LAB_00125a31:
              uVar10 = (pWVar23->offsetAndKind).value;
              bVar25 = (uVar10 & 3) == 0;
              _kjCondition.left = (int *)((ulong)uVar10 & 0xffffffff00000003);
              _kjCondition._8_8_ = anon_var_dwarf_1caca;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar25);
              if (bVar25) {
                uVar10 = uVar10 >> 2 & 0x1fffffff;
                f.exception = (Exception *)
                              (((ulong)(pWVar23->field_1).structRef.ptrCount.value +
                               (ulong)(pWVar23->field_1).structRef.dataSize.value) * (ulong)uVar10);
                _kjCondition.left = (int *)&f;
                _kjCondition._8_8_ = &wordCount;
                _kjCondition.op.content.ptr = " <= ";
                _kjCondition.op.content.size_ = 5;
                bVar25 = (long)f.exception - (long)pEVar8 == 0;
                _kjCondition.result = f.exception < pEVar8 || bVar25;
                if (f.exception < pEVar8 || bVar25) {
                  puVar24 = (undefined1 *)((long)&((f.exception)->ownFile).content.ptr + 1);
                  uVar7 = (uint)(pWVar23->field_1).structRef.ptrCount.value;
                  if (uVar7 != 0) {
                    uVar9 = (pWVar23->field_1).structRef.dataSize.value;
                    pWVar23 = pWVar23 + 1;
                    puVar14 = (undefined1 *)0x0;
                    for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
                      pWVar23 = pWVar23 + uVar9;
                      uVar16 = uVar7;
                      while (bVar25 = uVar16 != 0, uVar16 = uVar16 - 1, bVar25) {
                        MVar26 = totalSize(segment_local,pWVar23,nestingLimit_local);
                        puVar24 = puVar24 + MVar26.wordCount;
                        puVar14 = (undefined1 *)(ulong)((int)puVar14 + MVar26.capCount);
                        pWVar23 = pWVar23 + 1;
                      }
                    }
                    goto LAB_00125832;
                  }
                  goto LAB_0012588e;
                }
                pDVar15 = (DebugComparison<int_&,_int> *)&f_3;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&,char_const(&)[319]>
                          ((Fault *)pDVar15,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x368,FAILED,"actualSize <= wordCount",
                           "_kjCondition,\"Struct list pointer\'s elements overran size. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                           ,(DebugComparison<unsigned_long_&,_unsigned_int_&> *)&_kjCondition,
                           (char (*) [319])
                           "Struct list pointer\'s elements overran size. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                          );
                goto LAB_00125825;
              }
              pDVar15 = (DebugComparison<int_&,_int> *)&f;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[54]>
                        ((Fault *)pDVar15,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x360,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                         "_kjCondition,\"Don\'t know how to handle non-STRUCT inline composite.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
            }
            else {
              if ((ulong)((long)pEVar8->trace +
                         ((long)pWVar23 - (long)(segment_local->ptr).ptr >> 3) + -0x67) <=
                  (segment_local->ptr).size_) {
                puVar24 = (undefined1 *)((long)&(pEVar8->ownFile).content.ptr + 1);
                puVar14 = (undefined1 *)segment_local->readLimiter->limit;
                if (puVar24 <= puVar14) {
                  segment_local->readLimiter->limit = (long)puVar14 - (long)puVar24;
                  goto LAB_00125a31;
                }
                (*segment_local->arena->_vptr_Arena[3])();
              }
              f.exception = f.exception & 0xffffffffffffff00;
              pDVar15 = &_kjCondition;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                        ((Fault *)pDVar15,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x358,FAILED,
                         "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                         "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)&f,
                         (char (*) [320])
                         "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
            }
            kj::_::Debug::Fault::~Fault((Fault *)pDVar15);
            goto LAB_0012582f;
          }
          f.exception = f.exception & 0xffffffffffffff00;
          pDVar15 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar6,FAILED,pcVar18,
                     "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [320])
                     "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          break;
        case 2:
switchD_00125658_caseD_2:
          _kjCondition.left = (int *)ppSVar3;
          pDVar15 = &_kjCondition;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    ((Fault *)pDVar15,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x385,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          break;
        case 3:
switchD_00125658_caseD_3:
          puVar24 = (undefined1 *)0x0;
          if (uVar10 == 3) {
            puVar14 = (undefined1 *)0x1;
            goto LAB_00125832;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x38d,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                     (char (*) [22])"Unknown pointer type.");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
LAB_0012588e:
          puVar14 = (undefined1 *)0x0;
          goto LAB_00125832;
        }
      }
    }
LAB_00125825:
    kj::_::Debug::Fault::~Fault((Fault *)pDVar15);
  }
LAB_0012582f:
  puVar14 = (undefined1 *)0x0;
  puVar24 = (undefined1 *)0x0;
LAB_00125832:
  MVar26._8_8_ = puVar14;
  MVar26.wordCount = (WordCountN<61,_uint64_t>)puVar24;
  return MVar26;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_SOME(p, followFars(ref, ref->target(segment), segment)) {
      ptr = &p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }